

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

void allocate(file *file,int allocate_idat)

{
  control *control;
  int allocate_idat_local;
  file *file_local;
  
  if (allocate_idat == 0) {
    if (file->chunk != (chunk *)0x0) {
      __assert_fail("file->chunk == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xdde,"void allocate(struct file *, int)");
    }
    chunk_init((chunk *)((long)file->alloc_ptr + 0x160),file);
  }
  else {
    if (file->idat != (IDAT *)0x0) {
      __assert_fail("file->idat == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xdd8,"void allocate(struct file *, int)");
    }
    IDAT_init((IDAT *)((long)file->alloc_ptr + 0x1b8),file);
  }
  return;
}

Assistant:

static void
allocate(struct file *file, int allocate_idat)
{
   struct control *control = voidcast(struct control*, file->alloc_ptr);

   if (allocate_idat)
   {
      assert(file->idat == NULL);
      IDAT_init(&control->idat, file);
   }

   else /* chunk */
   {
      assert(file->chunk == NULL);
      chunk_init(&control->chunk, file);
   }
}